

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormat::FieldDataOnlyByteSize
                 (FieldDescriptor *field,Message *message)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  Descriptor *pDVar4;
  size_t sVar5;
  EnumValueDescriptor *pEVar6;
  Reflection *this;
  FieldDescriptor *in_RDI;
  string *value;
  string scratch;
  int j_9;
  int j_8;
  int j_7;
  int j_6;
  int j_5;
  int j_4;
  int j_3;
  int j_2;
  int j_1;
  int j;
  size_t count;
  size_t size;
  FieldDescriptor *value_field;
  FieldDescriptor *key_field;
  MapIterator end;
  MapIterator iter;
  MapFieldBase *map_field;
  size_t data_size;
  Reflection *message_reflection;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  MapFieldBase *in_stack_fffffffffffffe60;
  Reflection *in_stack_fffffffffffffe68;
  Reflection *in_stack_fffffffffffffe70;
  Reflection *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  Message *in_stack_fffffffffffffed0;
  Reflection *in_stack_fffffffffffffed8;
  string local_108 [8];
  MapValueRef *in_stack_ffffffffffffff00;
  FieldDescriptor *in_stack_ffffffffffffff08;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  MapIterator *in_stack_ffffffffffffff40;
  size_t sVar7;
  MapKey *in_stack_ffffffffffffff60;
  FieldDescriptor *in_stack_ffffffffffffff68;
  undefined1 local_90 [48];
  MapIterator local_60;
  MapFieldBase *local_30;
  size_t local_28;
  Reflection *local_20;
  FieldDescriptor *local_10;
  size_t local_8;
  
  local_10 = in_RDI;
  local_20 = Message::GetReflection((Message *)in_stack_fffffffffffffe60);
  local_28 = 0;
  bVar1 = FieldDescriptor::is_map((FieldDescriptor *)in_stack_fffffffffffffe60);
  if (bVar1) {
    local_30 = Reflection::GetMapData
                         (in_stack_fffffffffffffe70,(Message *)in_stack_fffffffffffffe68,
                          (FieldDescriptor *)in_stack_fffffffffffffe60);
    bVar1 = MapFieldBase::IsMapValid(in_stack_fffffffffffffe60);
    if (bVar1) {
      MapIterator::MapIterator
                (in_stack_ffffffffffffff40,
                 (Message *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      MapIterator::MapIterator
                (in_stack_ffffffffffffff40,
                 (Message *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      pDVar4 = FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffffe60);
      Descriptor::field(pDVar4,0);
      pDVar4 = FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffffe60);
      Descriptor::field(pDVar4,1);
      (*local_30->_vptr_MapFieldBase[6])(local_30,&local_60);
      (*local_30->_vptr_MapFieldBase[7])(local_30,local_90);
      while (bVar1 = protobuf::operator!=
                               ((MapIterator *)in_stack_fffffffffffffe60,
                                (MapIterator *)
                                CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),
            bVar1) {
        MapIterator::GetKey(&local_60);
        MapKeyDataOnlyByteSize(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        MapIterator::GetValueRef(&local_60);
        MapValueRefDataOnlyByteSize(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        sVar7 = WireFormatLite::LengthDelimitedSize((size_t)in_stack_fffffffffffffe60);
        local_28 = sVar7 + local_28;
        MapIterator::operator++((MapIterator *)in_stack_fffffffffffffe60);
      }
      local_8 = local_28;
      MapIterator::~MapIterator((MapIterator *)in_stack_fffffffffffffe60);
      MapIterator::~MapIterator((MapIterator *)in_stack_fffffffffffffe60);
      return local_8;
    }
  }
  sVar7 = 0;
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x47ca3e);
  if (bVar1) {
    iVar2 = Reflection::FieldSize
                      (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                       (FieldDescriptor *)
                       CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    sVar7 = FromIntSize(iVar2);
  }
  else {
    pDVar4 = FieldDescriptor::containing_type(local_10);
    Descriptor::options(pDVar4);
    bVar1 = MessageOptions::map_entry((MessageOptions *)0x47ca8f);
    if (bVar1) {
      sVar7 = 1;
    }
    else {
      bVar1 = Reflection::HasField
                        (in_stack_fffffffffffffe78,(Message *)in_stack_fffffffffffffe70,
                         (FieldDescriptor *)in_stack_fffffffffffffe68);
      if (bVar1) {
        sVar7 = 1;
      }
    }
  }
  TVar3 = FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffffe70);
  this = (Reflection *)(ulong)(TVar3 - TYPE_DOUBLE);
  switch(this) {
  case (Reflection *)0x0:
    local_28 = sVar7 * 8 + local_28;
    break;
  case (Reflection *)0x1:
    local_28 = sVar7 * 4 + local_28;
    break;
  case (Reflection *)0x2:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x47cbd0);
    if (bVar1) {
      for (iVar2 = 0; (ulong)(long)iVar2 < sVar7; iVar2 = iVar2 + 1) {
        Reflection::GetRepeatedInt64
                  (in_stack_fffffffffffffe78,(Message *)in_stack_fffffffffffffe70,
                   (FieldDescriptor *)in_stack_fffffffffffffe68,
                   (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        sVar5 = WireFormatLite::Int64Size(0x47cc1f);
        local_28 = sVar5 + local_28;
      }
    }
    else {
      Reflection::GetInt64
                (in_stack_fffffffffffffe78,(Message *)in_stack_fffffffffffffe70,
                 (FieldDescriptor *)in_stack_fffffffffffffe68);
      sVar7 = WireFormatLite::Int64Size(0x47cc69);
      local_28 = sVar7 + local_28;
    }
    break;
  case (Reflection *)0x3:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x47ceb8);
    if (bVar1) {
      for (local_d8 = 0; (ulong)(long)local_d8 < sVar7; local_d8 = local_d8 + 1) {
        Reflection::GetRepeatedUInt64
                  (in_stack_fffffffffffffe78,(Message *)in_stack_fffffffffffffe70,
                   (FieldDescriptor *)in_stack_fffffffffffffe68,
                   (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        sVar5 = WireFormatLite::UInt64Size(0x47cf07);
        local_28 = sVar5 + local_28;
      }
    }
    else {
      Reflection::GetUInt64
                (in_stack_fffffffffffffe78,(Message *)in_stack_fffffffffffffe70,
                 (FieldDescriptor *)in_stack_fffffffffffffe68);
      sVar7 = WireFormatLite::UInt64Size(0x47cf51);
      local_28 = sVar7 + local_28;
    }
    break;
  case (Reflection *)0x4:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x47cb17);
    if (bVar1) {
      for (iVar2 = 0; (ulong)(long)iVar2 < sVar7; iVar2 = iVar2 + 1) {
        Reflection::GetRepeatedInt32
                  (in_stack_fffffffffffffe78,(Message *)in_stack_fffffffffffffe70,
                   (FieldDescriptor *)in_stack_fffffffffffffe68,
                   (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        sVar5 = WireFormatLite::Int32Size(0);
        local_28 = sVar5 + local_28;
      }
    }
    else {
      Reflection::GetInt32
                (in_stack_fffffffffffffe78,(Message *)in_stack_fffffffffffffe70,
                 (FieldDescriptor *)in_stack_fffffffffffffe68);
      sVar7 = WireFormatLite::Int32Size(0);
      local_28 = sVar7 + local_28;
    }
    break;
  case (Reflection *)0x5:
    local_28 = sVar7 * 8 + local_28;
    break;
  case (Reflection *)0x6:
    local_28 = sVar7 * 4 + local_28;
    break;
  case (Reflection *)0x7:
    local_28 = sVar7 + local_28;
    break;
  case (Reflection *)0x8:
  case (Reflection *)0xb:
    for (local_e8 = 0; (ulong)(long)local_e8 < sVar7; local_e8 = local_e8 + 1) {
      std::__cxx11::string::string(local_108);
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x47d2cf);
      if (bVar1) {
        in_stack_fffffffffffffe70 =
             (Reflection *)
             Reflection::GetRepeatedStringReference
                       (this,(Message *)CONCAT17(bVar1,in_stack_fffffffffffffe80),
                        (FieldDescriptor *)in_stack_fffffffffffffe78,
                        (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                        (string *)in_stack_fffffffffffffe68);
        in_stack_fffffffffffffe78 = in_stack_fffffffffffffe70;
      }
      else {
        in_stack_fffffffffffffe68 =
             (Reflection *)
             Reflection::GetStringReference
                       ((Reflection *)CONCAT17(bVar1,in_stack_fffffffffffffe80),
                        (Message *)in_stack_fffffffffffffe78,
                        (FieldDescriptor *)in_stack_fffffffffffffe70,
                        (string *)in_stack_fffffffffffffe68);
        in_stack_fffffffffffffe70 = in_stack_fffffffffffffe68;
      }
      sVar5 = WireFormatLite::StringSize((string *)0x47d370);
      local_28 = sVar5 + local_28;
      std::__cxx11::string::~string(local_108);
    }
    break;
  case (Reflection *)0x9:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x47d05a);
    if (bVar1) {
      for (local_dc = 0; (ulong)(long)local_dc < sVar7; local_dc = local_dc + 1) {
        Reflection::GetRepeatedMessage
                  (in_stack_fffffffffffffe78,(Message *)in_stack_fffffffffffffe70,
                   (FieldDescriptor *)in_stack_fffffffffffffe68,
                   (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        sVar5 = WireFormatLite::GroupSize<google::protobuf::Message>((Message *)0x47d0a9);
        local_28 = sVar5 + local_28;
      }
    }
    else {
      Reflection::GetMessage
                (this,(Message *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                 (FieldDescriptor *)in_stack_fffffffffffffe78,
                 (MessageFactory *)in_stack_fffffffffffffe70);
      sVar7 = WireFormatLite::GroupSize<google::protobuf::Message>((Message *)0x47d0f7);
      local_28 = sVar7 + local_28;
    }
    break;
  case (Reflection *)0xa:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x47d119);
    if (bVar1) {
      for (local_e0 = 0; (ulong)(long)local_e0 < sVar7; local_e0 = local_e0 + 1) {
        Reflection::GetRepeatedMessage
                  (in_stack_fffffffffffffe78,(Message *)in_stack_fffffffffffffe70,
                   (FieldDescriptor *)in_stack_fffffffffffffe68,
                   (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        sVar5 = WireFormatLite::MessageSize<google::protobuf::Message>((Message *)0x47d168);
        local_28 = sVar5 + local_28;
      }
    }
    else {
      Reflection::GetMessage
                (this,(Message *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                 (FieldDescriptor *)in_stack_fffffffffffffe78,
                 (MessageFactory *)in_stack_fffffffffffffe70);
      sVar7 = WireFormatLite::MessageSize<google::protobuf::Message>((Message *)0x47d1b6);
      local_28 = sVar7 + local_28;
    }
    break;
  case (Reflection *)0xc:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x47cdff);
    if (bVar1) {
      for (local_d4 = 0; (ulong)(long)local_d4 < sVar7; local_d4 = local_d4 + 1) {
        Reflection::GetRepeatedUInt32
                  (in_stack_fffffffffffffe78,(Message *)in_stack_fffffffffffffe70,
                   (FieldDescriptor *)in_stack_fffffffffffffe68,
                   (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        sVar5 = WireFormatLite::UInt32Size(0);
        local_28 = sVar5 + local_28;
      }
    }
    else {
      Reflection::GetUInt32
                (in_stack_fffffffffffffe78,(Message *)in_stack_fffffffffffffe70,
                 (FieldDescriptor *)in_stack_fffffffffffffe68);
      sVar7 = WireFormatLite::UInt32Size(0);
      local_28 = sVar7 + local_28;
    }
    break;
  case (Reflection *)0xd:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x47d1d8);
    if (bVar1) {
      for (local_e4 = 0; (ulong)(long)local_e4 < sVar7; local_e4 = local_e4 + 1) {
        pEVar6 = Reflection::GetRepeatedEnum
                           (in_stack_fffffffffffffe70,(Message *)in_stack_fffffffffffffe68,
                            (FieldDescriptor *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        EnumValueDescriptor::number(pEVar6);
        sVar5 = WireFormatLite::EnumSize(0);
        local_28 = sVar5 + local_28;
      }
    }
    else {
      pEVar6 = Reflection::GetEnum(in_stack_fffffffffffffe70,(Message *)in_stack_fffffffffffffe68,
                                   (FieldDescriptor *)in_stack_fffffffffffffe60);
      EnumValueDescriptor::number(pEVar6);
      sVar7 = WireFormatLite::EnumSize(0);
      local_28 = sVar7 + local_28;
    }
    break;
  case (Reflection *)0xe:
    local_28 = sVar7 * 4 + local_28;
    break;
  case (Reflection *)0xf:
    local_28 = sVar7 * 8 + local_28;
    break;
  case (Reflection *)0x10:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x47cc8b);
    if (bVar1) {
      for (iVar2 = 0; (ulong)(long)iVar2 < sVar7; iVar2 = iVar2 + 1) {
        Reflection::GetRepeatedInt32
                  (in_stack_fffffffffffffe78,(Message *)in_stack_fffffffffffffe70,
                   (FieldDescriptor *)in_stack_fffffffffffffe68,
                   (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        sVar5 = WireFormatLite::SInt32Size(0);
        local_28 = sVar5 + local_28;
      }
    }
    else {
      Reflection::GetInt32
                (in_stack_fffffffffffffe78,(Message *)in_stack_fffffffffffffe70,
                 (FieldDescriptor *)in_stack_fffffffffffffe68);
      sVar7 = WireFormatLite::SInt32Size(0);
      local_28 = sVar7 + local_28;
    }
    break;
  case (Reflection *)0x11:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x47cd44);
    if (bVar1) {
      for (iVar2 = 0; (ulong)(long)iVar2 < sVar7; iVar2 = iVar2 + 1) {
        Reflection::GetRepeatedInt64
                  (in_stack_fffffffffffffe78,(Message *)in_stack_fffffffffffffe70,
                   (FieldDescriptor *)in_stack_fffffffffffffe68,
                   (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        sVar5 = WireFormatLite::SInt64Size(0x47cd93);
        local_28 = sVar5 + local_28;
      }
    }
    else {
      Reflection::GetInt64
                (in_stack_fffffffffffffe78,(Message *)in_stack_fffffffffffffe70,
                 (FieldDescriptor *)in_stack_fffffffffffffe68);
      sVar7 = WireFormatLite::SInt64Size(0x47cddd);
      local_28 = sVar7 + local_28;
    }
  }
  return local_28;
}

Assistant:

size_t WireFormat::FieldDataOnlyByteSize(const FieldDescriptor* field,
                                         const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t data_size = 0;

  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      MapIterator iter(const_cast<Message*>(&message), field);
      MapIterator end(const_cast<Message*>(&message), field);
      const FieldDescriptor* key_field = field->message_type()->field(0);
      const FieldDescriptor* value_field = field->message_type()->field(1);
      for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
           ++iter) {
        size_t size = kMapEntryTagByteSize;
        size += MapKeyDataOnlyByteSize(key_field, iter.GetKey());
        size += MapValueRefDataOnlyByteSize(value_field, iter.GetValueRef());
        data_size += WireFormatLite::LengthDelimitedSize(size);
      }
      return data_size;
    }
  }

  size_t count = 0;
  if (field->is_repeated()) {
    count =
        internal::FromIntSize(message_reflection->FieldSize(message, field));
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  switch (field->type()) {
#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE:                                        \
    if (field->is_repeated()) {                                             \
      for (int j = 0; j < count; j++) {                                     \
        data_size += WireFormatLite::TYPE_METHOD##Size(                     \
            message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                            j));            \
      }                                                                     \
    } else {                                                                \
      data_size += WireFormatLite::TYPE_METHOD##Size(                       \
          message_reflection->Get##CPPTYPE_METHOD(message, field));         \
    }                                                                       \
    break;

#define HANDLE_FIXED_TYPE(TYPE, TYPE_METHOD)                   \
  case FieldDescriptor::TYPE_##TYPE:                           \
    data_size += count * WireFormatLite::k##TYPE_METHOD##Size; \
    break;

    HANDLE_TYPE(INT32, Int32, Int32)
    HANDLE_TYPE(INT64, Int64, Int64)
    HANDLE_TYPE(SINT32, SInt32, Int32)
    HANDLE_TYPE(SINT64, SInt64, Int64)
    HANDLE_TYPE(UINT32, UInt32, UInt32)
    HANDLE_TYPE(UINT64, UInt64, UInt64)

    HANDLE_FIXED_TYPE(FIXED32, Fixed32)
    HANDLE_FIXED_TYPE(FIXED64, Fixed64)
    HANDLE_FIXED_TYPE(SFIXED32, SFixed32)
    HANDLE_FIXED_TYPE(SFIXED64, SFixed64)

    HANDLE_FIXED_TYPE(FLOAT, Float)
    HANDLE_FIXED_TYPE(DOUBLE, Double)

    HANDLE_FIXED_TYPE(BOOL, Bool)

    HANDLE_TYPE(GROUP, Group, Message)
    HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE
#undef HANDLE_FIXED_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      if (field->is_repeated()) {
        for (int j = 0; j < count; j++) {
          data_size += WireFormatLite::EnumSize(
              message_reflection->GetRepeatedEnum(message, field, j)->number());
        }
      } else {
        data_size += WireFormatLite::EnumSize(
            message_reflection->GetEnum(message, field)->number());
      }
      break;
    }

    // Handle strings separately so that we can get string references
    // instead of copying.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      for (int j = 0; j < count; j++) {
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        data_size += WireFormatLite::StringSize(value);
      }
      break;
    }
  }
  return data_size;
}